

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

void __thiscall slang::parsing::Parser::handleExponentSplit(Parser *this,Token token,size_t offset)

{
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  KeywordVersion KVar1;
  Preprocessor *this_00;
  span<const_slang::parsing::Token,_18446744073709551615UL> *in_RCX;
  ParserBase *in_RDI;
  SmallVector<slang::parsing::Token,_4UL> split;
  size_t in_stack_00000398;
  SourceManager *in_stack_000003a0;
  Diagnostics *in_stack_000003a8;
  BumpAllocator *in_stack_000003b0;
  Token in_stack_000003b8;
  KeywordVersion in_stack_000003d0;
  SmallVectorBase<slang::parsing::Token> *in_stack_000003d8;
  ParserBase *this_01;
  undefined7 in_stack_ffffffffffffff18;
  __extent_storage<18446744073709551615UL> local_20;
  
  local_20._M_extent_value = (size_t)in_RCX;
  SmallVector<slang::parsing::Token,_4UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_4UL> *)0x2e0c01);
  ParserBase::getDiagnostics((ParserBase *)0x2e0c13);
  this_00 = ParserBase::getPP(in_RDI);
  Preprocessor::getSourceManager(this_00);
  ParserBase::getPP(in_RDI);
  KVar1 = Preprocessor::getCurrentKeywordVersion((Preprocessor *)0x2e0c71);
  this_01 = (ParserBase *)&stack0xffffffffffffff88;
  Lexer::splitTokens(in_stack_000003b0,in_stack_000003a8,in_stack_000003a0,in_stack_000003b8,
                     in_stack_00000398,in_stack_000003d0,in_stack_000003d8);
  std::span<const_slang::parsing::Token,_18446744073709551615UL>::
  span<slang::SmallVector<slang::parsing::Token,_4UL>_&>
            ((span<const_slang::parsing::Token,_18446744073709551615UL> *)local_20._M_extent_value,
             (SmallVector<slang::parsing::Token,_4UL> *)CONCAT17(KVar1,in_stack_ffffffffffffff18));
  tokens._M_ptr._7_1_ = KVar1;
  tokens._M_ptr._0_7_ = in_stack_ffffffffffffff18;
  tokens._M_extent._M_extent_value = local_20._M_extent_value;
  ParserBase::pushTokens(this_01,tokens);
  SmallVector<slang::parsing::Token,_4UL>::~SmallVector
            ((SmallVector<slang::parsing::Token,_4UL> *)0x2e0cec);
  return;
}

Assistant:

void Parser::handleExponentSplit(Token token, size_t offset) {
    SmallVector<Token, 4> split;
    Lexer::splitTokens(alloc, getDiagnostics(), getPP().getSourceManager(), token, offset,
                       getPP().getCurrentKeywordVersion(), split);

    pushTokens(split);
}